

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

int m_se(aec_stream_conflict *strm)

{
  internal_state_conflict *piVar1;
  byte *pbVar2;
  long lVar3;
  internal_state_conflict *state;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  uint32_t uVar10;
  int iVar11;
  uint32_t *puVar12;
  ulong uVar13;
  
  piVar1 = strm->state;
  if ((strm->avail_in < (ulong)piVar1->in_blklen) ||
     (uVar5 = strm->avail_out, uVar5 < piVar1->out_blklen)) {
    piVar1->mode = m_se_decode;
    piVar1->sample_counter = piVar1->ref;
  }
  else {
    uVar13 = strm->avail_in;
    for (uVar7 = piVar1->ref; uVar7 < strm->block_size; uVar7 = uVar7 + 1) {
      iVar9 = piVar1->bitp;
      if (iVar9 == 0) {
        piVar1->acc = 0;
LAB_001053b4:
        uVar4 = 0;
        iVar11 = 0;
        uVar8 = uVar13;
        do {
          uVar13 = uVar8 - 7;
          if (uVar8 < 7) goto LAB_00105454;
          pbVar2 = strm->next_in;
          iVar11 = iVar11 + iVar9;
          uVar6 = (ulong)pbVar2[6] |
                  (ulong)pbVar2[5] << 8 |
                  (ulong)pbVar2[4] << 0x10 |
                  (ulong)pbVar2[3] << 0x18 |
                  (ulong)pbVar2[2] << 0x20 | (ulong)pbVar2[1] << 0x28 | (ulong)*pbVar2 << 0x30;
          piVar1->acc = uVar6;
          strm->next_in = pbVar2 + 7;
          strm->avail_in = uVar13;
          piVar1->bitp = 0x38;
          iVar9 = 0x38;
          uVar8 = uVar13;
        } while (uVar6 == 0);
        iVar11 = iVar11 + -0x40;
      }
      else {
        uVar6 = (piVar1->acc << (-(char)iVar9 & 0x3fU)) >> (-(char)iVar9 & 0x3fU);
        piVar1->acc = uVar6;
        iVar11 = -0x40;
        if (uVar6 == 0) goto LAB_001053b4;
      }
      lVar3 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      piVar1->bitp = (uint)lVar3;
      uVar4 = ((uint)lVar3 ^ 0x3f) + iVar9 + iVar11;
      uVar8 = uVar13;
      if (0x5a < uVar4) {
        return -1;
      }
LAB_00105454:
      uVar10 = uVar4 - piVar1->se_table[(ulong)uVar4 * 2 + 1];
      puVar12 = piVar1->rsip;
      if ((uVar7 & 1) == 0) {
        *puVar12 = piVar1->se_table[uVar4 * 2] - uVar10;
        puVar12 = puVar12 + 1;
        uVar5 = uVar5 - piVar1->bytes_per_sample;
        uVar7 = uVar7 | 1;
      }
      piVar1->rsip = puVar12 + 1;
      *puVar12 = uVar10;
      uVar5 = uVar5 - piVar1->bytes_per_sample;
      strm->avail_out = uVar5;
      uVar13 = uVar8;
    }
    piVar1->mode = m_next_cds;
  }
  return 1;
}

Assistant:

static int m_se(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    if (BUFFERSPACE(strm)) {
        uint32_t i = state->ref;

        while (i < strm->block_size) {
            uint32_t m = direct_get_fs(strm);
            int32_t d1;

            if (m > SE_TABLE_SIZE)
                return M_ERROR;

            d1 = m - state->se_table[2 * m + 1];

            if ((i & 1) == 0) {
                put_sample(strm, state->se_table[2 * m] - d1);
                i++;
            }
            put_sample(strm, d1);
            i++;
        }
        state->mode = m_next_cds;
    } else {
        state->mode = m_se_decode;
        state->sample_counter = state->ref;
    }
    return M_CONTINUE;
}